

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O0

int __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoLinear>::ClassId
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoLinear> *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  string *str;
  allocator<char> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  TPZGeoLinear *in_stack_ffffffffffffffd0;
  string local_28 [40];
  
  str = (string *)&stack0xffffffffffffffd7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  uVar1 = Hash(str);
  iVar2 = TPZCompEl::ClassId((TPZCompEl *)0x1b531cd);
  pzgeom::TPZGeoLinear::TPZGeoLinear((TPZGeoLinear *)CONCAT44(uVar1,iVar2));
  iVar3 = pzgeom::TPZGeoLinear::ClassId(in_stack_ffffffffffffffd0);
  pzgeom::TPZGeoLinear::~TPZGeoLinear((TPZGeoLinear *)0x1b5321a);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd7);
  return uVar1 ^ iVar2 * 2 ^ iVar3 << 2;
}

Assistant:

int TPZMultiphysicsCompEl<TGeometry>::ClassId() const{
    return Hash("TPZMultiphysicsCompEl") ^ TPZMultiphysicsElement::ClassId() << 1 ^ TGeometry().ClassId() << 2;
}